

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

tuple<bool,_unsigned_int,_unsigned_int> __thiscall V4L2Device::parse_resolution(V4L2Device *this)

{
  Options *this_00;
  OptionDetails *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  unsigned_long uVar3;
  Writer *pWVar4;
  undefined4 extraout_EDX;
  undefined1 uVar5;
  long in_RSI;
  int iVar6;
  int iVar7;
  tuple<bool,_unsigned_int,_unsigned_int> tVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resolution;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> y_str;
  Writer local_98;
  
  this_00 = *(Options **)(in_RSI + 0x208);
  std::__cxx11::string::string((string *)&local_98,"resolution",(allocator *)&x_str);
  this_01 = cxxopts::Options::operator[](this_00,(string *)&local_98);
  pbVar1 = cxxopts::OptionDetails::as<std::__cxx11::string>(this_01);
  std::__cxx11::string::string((string *)&resolution,(string *)pbVar1);
  std::__cxx11::string::~string((string *)&local_98);
  lVar2 = std::__cxx11::string::find((char *)&resolution,0x160a24);
  if ((lVar2 == -1) || (resolution._M_string_length <= lVar2 + 1U)) {
    local_98._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
    local_98.m_level = Error;
    local_98.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_98.m_line = 0x19b;
    local_98.m_func = "std::tuple<bool, uint32_t, uint32_t> V4L2Device::parse_resolution()";
    local_98.m_verboseLevel = 0;
    local_98.m_logger = (Logger *)0x0;
    local_98.m_proceed = false;
    local_98.m_messageBuilder.m_logger = (Logger *)0x0;
    local_98.m_messageBuilder.m_containerLogSeperator = "";
    local_98.m_dispatchAction = NormalLog;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar4 = el::base::Writer::construct(&local_98,1,"default");
    pWVar4 = el::base::Writer::operator<<(pWVar4,(char (*) [33])"invalid resolution description: ");
    el::base::Writer::operator<<(pWVar4,&resolution);
    el::base::Writer::~Writer(&local_98);
    iVar6 = 0;
    iVar7 = 0;
    uVar5 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&x_str,(ulong)&resolution);
    std::__cxx11::string::substr((ulong)&y_str,(ulong)&resolution);
    uVar3 = std::__cxx11::stoul(&x_str,(size_t *)0x0,10);
    iVar6 = (int)uVar3;
    uVar3 = std::__cxx11::stoul(&y_str,(size_t *)0x0,10);
    iVar7 = (int)uVar3;
    uVar5 = 1;
    std::__cxx11::string::~string((string *)&y_str);
    std::__cxx11::string::~string((string *)&x_str);
  }
  this->fd = iVar7;
  this->frames_taken = iVar6;
  *(undefined1 *)&(this->buffers)._M_elems[0].start = uVar5;
  std::__cxx11::string::~string((string *)&resolution);
  tVar8.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>._8_4_ = extraout_EDX;
  tVar8.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
       (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
  return (tuple<bool,_unsigned_int,_unsigned_int>)
         tVar8.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>;
}

Assistant:

std::tuple<bool, uint32_t, uint32_t>
    parse_resolution()
    {
        uint32_t x = 0, y = 0;
        bool ok = true;

        auto resolution = (*options)["resolution"].as<std::string>();
        auto delimeter = resolution.find("x");

        if ((delimeter != std::string::npos) and (delimeter + 1 < resolution.size())) {
            auto x_str = resolution.substr(0, delimeter);
            auto y_str = resolution.substr(delimeter + 1, resolution.size() - 1);

            try {
                x = std::stoul(x_str);
                y = std::stoul(y_str);
            } catch (std::invalid_argument& exc) {
                LOG(ERROR) << "no conversion could be performed: " << exc.what();
                ok = false;
            } catch (std::out_of_range& exc) {
                LOG(ERROR) << "out of range error: " << exc.what();
                ok = false;
            }
        } else {
            LOG(ERROR) << "invalid resolution description: " << resolution;
            ok = false;
        }

        return std::make_tuple(ok, x, y);
    }